

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O1

FeatureOptions<wasm::BinaryOp> * __thiscall
wasm::Random::FeatureOptions<wasm::BinaryOp>::
add<wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp>
          (FeatureOptions<wasm::BinaryOp> *this,FeatureSet feature,BinaryOp option,BinaryOp rest,
          BinaryOp rest_1,BinaryOp rest_2,BinaryOp rest_3,BinaryOp rest_4,BinaryOp rest_5,
          BinaryOp rest_6,BinaryOp rest_7,BinaryOp rest_8,BinaryOp rest_9,BinaryOp rest_10,
          BinaryOp rest_11,BinaryOp rest_12,BinaryOp rest_13,BinaryOp rest_14,BinaryOp rest_15,
          BinaryOp rest_16,BinaryOp rest_17,BinaryOp rest_18,BinaryOp rest_19,BinaryOp rest_20,
          BinaryOp rest_21,BinaryOp rest_22,BinaryOp rest_23,BinaryOp rest_24,BinaryOp rest_25,
          BinaryOp rest_26,BinaryOp rest_27,BinaryOp rest_28,BinaryOp rest_29,BinaryOp rest_30,
          BinaryOp rest_31,BinaryOp rest_32,BinaryOp rest_33,BinaryOp rest_34,BinaryOp rest_35,
          BinaryOp rest_36,BinaryOp rest_37,BinaryOp rest_38,BinaryOp rest_39,BinaryOp rest_40,
          BinaryOp rest_41,BinaryOp rest_42,BinaryOp rest_43,BinaryOp rest_44,BinaryOp rest_45,
          BinaryOp rest_46,BinaryOp rest_47,BinaryOp rest_48,BinaryOp rest_49,BinaryOp rest_50,
          BinaryOp rest_51,BinaryOp rest_52,BinaryOp rest_53,BinaryOp rest_54,BinaryOp rest_55,
          BinaryOp rest_56,BinaryOp rest_57,BinaryOp rest_58)

{
  iterator __position;
  vector<wasm::BinaryOp,std::allocator<wasm::BinaryOp>> *this_00;
  FeatureOptions<wasm::BinaryOp> *pFVar1;
  key_type local_38;
  BinaryOp local_34;
  FeatureSet feature_local;
  BinaryOp option_local;
  
  local_38.features = feature.features;
  local_34 = option;
  this_00 = (vector<wasm::BinaryOp,std::allocator<wasm::BinaryOp>> *)
            std::
            map<wasm::FeatureSet,_std::vector<wasm::BinaryOp,_std::allocator<wasm::BinaryOp>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::BinaryOp,_std::allocator<wasm::BinaryOp>_>_>_>_>
            ::operator[](&this->options,&local_38);
  __position._M_current = *(BinaryOp **)(this_00 + 8);
  if (__position._M_current == *(BinaryOp **)(this_00 + 0x10)) {
    std::vector<wasm::BinaryOp,std::allocator<wasm::BinaryOp>>::
    _M_realloc_insert<wasm::BinaryOp_const&>(this_00,__position,&local_34);
  }
  else {
    *__position._M_current = local_34;
    *(BinaryOp **)(this_00 + 8) = __position._M_current + 1;
  }
  pFVar1 = add<wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp>
                     (this,(FeatureSet)local_38.features,rest,rest_1,rest_2,rest_3,rest_4,rest_5,
                      rest_6,rest_7,rest_8,rest_9,rest_10,rest_11,rest_12,rest_13,rest_14,rest_15,
                      rest_16,rest_17,rest_18,rest_19,rest_20,rest_21,rest_22,rest_23,rest_24,
                      rest_25,rest_26,rest_27,rest_28,rest_29,rest_30,rest_31,rest_32,rest_33,
                      rest_34,rest_35,rest_36,rest_37,rest_38,rest_39,rest_40,rest_41,rest_42,
                      rest_43,rest_44,rest_45,rest_46,rest_47,rest_48,rest_49,rest_50,rest_51,
                      rest_52,rest_53,rest_54,rest_55,rest_56,rest_57,rest_58);
  return pFVar1;
}

Assistant:

FeatureOptions<T>& add(FeatureSet feature, T option, Ts... rest) {
      options[feature].push_back(option);
      return add(feature, rest...);
    }